

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void Catch::cleanupSingletons(void)

{
  vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> *pvVar1;
  bool bVar2;
  vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> **ppvVar3;
  reference ppIVar4;
  ISingleton *singleton;
  iterator __end1;
  iterator __begin1;
  vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> *__range1;
  vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> **singletons;
  
  ppvVar3 = anon_unknown_1::getSingletons();
  pvVar1 = *ppvVar3;
  __end1 = clara::std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>::begin
                     (pvVar1);
  singleton = (ISingleton *)
              clara::std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>::end
                        (pvVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Catch::ISingleton_**,_std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>_>
                                *)&singleton);
    if (!bVar2) break;
    ppIVar4 = __gnu_cxx::
              __normal_iterator<Catch::ISingleton_**,_std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>_>
              ::operator*(&__end1);
    if (*ppIVar4 != (ISingleton *)0x0) {
      (*(*ppIVar4)->_vptr_ISingleton[1])();
    }
    __gnu_cxx::
    __normal_iterator<Catch::ISingleton_**,_std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>_>
    ::operator++(&__end1);
  }
  pvVar1 = *ppvVar3;
  if (pvVar1 != (vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> *)0x0) {
    clara::std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>::~vector(pvVar1);
    operator_delete(pvVar1);
  }
  *ppvVar3 = (vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> *)0x0;
  return;
}

Assistant:

void cleanupSingletons() {
        auto& singletons = getSingletons();
        for( auto singleton : *singletons )
            delete singleton;
        delete singletons;
        singletons = nullptr;
    }